

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_hdwallet.cpp
# Opt level: O3

CreateExtkeyResponseStruct *
cfd::js::api::HDWalletStructApi::CreateExtPubkey
          (CreateExtkeyResponseStruct *__return_storage_ptr__,CreateExtPubkeyRequestStruct *request)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_header *p_Var3;
  string *in_R8;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  _Any_data local_118;
  char local_108 [16];
  undefined1 local_f8 [40];
  _Alloc_hider local_d0;
  char local_c0 [16];
  _Alloc_hider local_b0;
  char local_a0 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_60;
  
  (__return_storage_ptr__->extkey)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->extkey).field_2;
  (__return_storage_ptr__->extkey)._M_string_length = 0;
  (__return_storage_ptr__->extkey).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->error).code = 0;
  (__return_storage_ptr__->error).type._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).type.field_2;
  (__return_storage_ptr__->error).type._M_string_length = 0;
  (__return_storage_ptr__->error).type.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->error).message._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).message.field_2;
  (__return_storage_ptr__->error).message._M_string_length = 0;
  (__return_storage_ptr__->error).message.field_2._M_local_buf[0] = '\0';
  p_Var3 = &(__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var3->_M_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var3->_M_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_138._0_8_ = (pointer)0x0;
  local_138._8_8_ = 0;
  local_128._8_8_ =
       std::
       _Function_handler<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtPubkeyRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_hdwallet.cpp:295:20)>
       ::_M_invoke;
  local_128._0_8_ =
       std::
       _Function_handler<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtPubkeyRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_hdwallet.cpp:295:20)>
       ::_M_manager;
  local_118._M_unused._M_object = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"CreateExtPubkey","");
  ExecuteStructApi<cfd::js::api::CreateExtPubkeyRequestStruct,cfd::js::api::CreateExtkeyResponseStruct>
            ((CreateExtkeyResponseStruct *)local_f8,(api *)request,
             (CreateExtPubkeyRequestStruct *)local_138,
             (function<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtPubkeyRequestStruct_&)>
              *)&local_118,in_R8);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_f8);
  (__return_storage_ptr__->error).code = local_f8._32_4_;
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->error).type,(string *)&local_d0);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->error).message,(string *)&local_b0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->error).ignore_items._M_t);
  if (local_90._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var2 = &local_90._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_color = local_90._M_impl.super__Rb_tree_header._M_header._M_color;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = local_90._M_impl.super__Rb_tree_header._M_header._M_parent;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_left = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = local_90._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_90._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var3->_M_header;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_90._M_impl.super__Rb_tree_header._M_node_count;
    local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_90._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_90._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->ignore_items)._M_t);
  if (_Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var3 = &_Stack_60._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         _Stack_60._M_impl.super__Rb_tree_header._M_header._M_color;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         _Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         _Stack_60._M_impl.super__Rb_tree_header._M_header._M_right;
    (_Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         _Stack_60._M_impl.super__Rb_tree_header._M_node_count;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&_Stack_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_90);
  if (local_b0._M_p != local_a0) {
    operator_delete(local_b0._M_p);
  }
  if (local_d0._M_p != local_c0) {
    operator_delete(local_d0._M_p);
  }
  if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
    operator_delete((void *)local_f8._0_8_);
  }
  if ((char *)local_118._M_unused._0_8_ != local_108) {
    operator_delete(local_118._M_unused._M_object);
  }
  if ((code *)local_128._0_8_ != (code *)0x0) {
    (*(code *)local_128._0_8_)(local_138,local_138,3);
  }
  return __return_storage_ptr__;
}

Assistant:

CreateExtkeyResponseStruct HDWalletStructApi::CreateExtPubkey(
    const CreateExtPubkeyRequestStruct& request) {
  auto call_func = [](const CreateExtPubkeyRequestStruct& request)
      -> CreateExtkeyResponseStruct {
    CreateExtkeyResponseStruct response;
    const NetType net_type = AddressStructApi::ConvertNetType(request.network);

    HDWalletApi api;
    std::string extkey = api.CreateExtPubkey(request.extkey, net_type);

    response.extkey = extkey;
    return response;
  };

  CreateExtkeyResponseStruct result;
  result = ExecuteStructApi<
      CreateExtPubkeyRequestStruct, CreateExtkeyResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}